

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_0::getFixedPointFormatThreshold
          (anon_unknown_0 *this,TextureFormat *sourceFormat,TextureFormat *readPixelsFormat)

{
  Vector<float,_4> VVar1;
  Vec4 VVar2;
  Vector<unsigned_long,_4> local_110;
  Vector<int,_4> local_f0;
  Vector<unsigned_long,_4> local_e0;
  Vector<unsigned_long,_4> local_c0;
  Vector<unsigned_long,_4> local_a0;
  Vector<unsigned_long,_4> local_80;
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  IVec4 readBits;
  IVec4 srcBits;
  TextureFormat *readPixelsFormat_local;
  TextureFormat *sourceFormat_local;
  
  tcu::getTextureFormatBitDepth((tcu *)(readBits.m_data + 2),sourceFormat);
  tcu::getTextureFormatBitDepth((tcu *)local_40,readPixelsFormat);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_60 + 0x10),3.0);
  tcu::Vector<unsigned_long,_4>::Vector(&local_c0,1);
  tcu::min<int,4>((tcu *)&local_f0,(Vector<int,_4> *)(readBits.m_data + 2),
                  (Vector<int,_4> *)local_40);
  tcu::Vector<int,_4>::cast<unsigned_long>(&local_e0,&local_f0);
  tcu::operator<<(&local_a0,&local_c0,&local_e0);
  tcu::Vector<unsigned_long,_4>::Vector(&local_110,1);
  tcu::operator-(&local_80,&local_a0,&local_110);
  tcu::Vector<unsigned_long,_4>::cast<float>((Vector<unsigned_long,_4> *)local_60);
  VVar1 = tcu::operator/((tcu *)this,(Vector<float,_4> *)(local_60 + 0x10),
                         (Vector<float,_4> *)local_60);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  VVar2.m_data[2] = VVar1.m_data[2];
  VVar2.m_data[3] = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 getFixedPointFormatThreshold (const tcu::TextureFormat& sourceFormat, const tcu::TextureFormat& readPixelsFormat)
{
	DE_ASSERT(tcu::getTextureChannelClass(sourceFormat.type) != tcu::TEXTURECHANNELCLASS_FLOATING_POINT);
	DE_ASSERT(tcu::getTextureChannelClass(readPixelsFormat.type) != tcu::TEXTURECHANNELCLASS_FLOATING_POINT);

	DE_ASSERT(tcu::getTextureChannelClass(sourceFormat.type) != tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER);
	DE_ASSERT(tcu::getTextureChannelClass(readPixelsFormat.type) != tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER);

	DE_ASSERT(tcu::getTextureChannelClass(sourceFormat.type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
	DE_ASSERT(tcu::getTextureChannelClass(readPixelsFormat.type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);

	const tcu::IVec4	srcBits		= tcu::getTextureFormatBitDepth(sourceFormat);
	const tcu::IVec4	readBits	= tcu::getTextureFormatBitDepth(readPixelsFormat);

	return Vec4(3.0f) / ((tcu::Vector<deUint64, 4>(1) << (tcu::min(srcBits, readBits).cast<deUint64>())) - tcu::Vector<deUint64, 4>(1)).cast<float>();
}